

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O0

Aig_Obj_t * Saig_ManGetLabeledRegister_rec(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pResult;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Aig_ObjSetTravIdCurrent(p,pObj);
    iVar1 = Saig_ObjIsPi(p,pObj);
    if (iVar1 == 0) {
      iVar1 = Saig_ObjIsLo(p,pObj);
      if (iVar1 == 0) {
        iVar1 = Aig_ObjIsNode(pObj);
        if (iVar1 == 0) {
          __assert_fail("Aig_ObjIsNode(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigMiter.c"
                        ,0x375,"Aig_Obj_t *Saig_ManGetLabeledRegister_rec(Aig_Man_t *, Aig_Obj_t *)"
                       );
        }
        pAVar2 = Aig_ObjFanin0(pObj);
        p_local = (Aig_Man_t *)Saig_ManGetLabeledRegister_rec(p,pAVar2);
        if (p_local == (Aig_Man_t *)0x0) {
          pAVar2 = Aig_ObjFanin1(pObj);
          p_local = (Aig_Man_t *)Saig_ManGetLabeledRegister_rec(p,pAVar2);
        }
      }
      else {
        p_local = (Aig_Man_t *)pObj;
        if (((*(ulong *)&pObj->field_0x18 >> 4 & 1) == 0) &&
           ((*(ulong *)&pObj->field_0x18 >> 5 & 1) == 0)) {
          pAVar2 = Saig_ObjLoToLi(p,pObj);
          pAVar2 = Aig_ObjFanin0(pAVar2);
          p_local = (Aig_Man_t *)Saig_ManGetLabeledRegister_rec(p,pAVar2);
        }
      }
    }
    else {
      p_local = (Aig_Man_t *)0x0;
    }
  }
  else {
    p_local = (Aig_Man_t *)0x0;
  }
  return (Aig_Obj_t *)p_local;
}

Assistant:

Aig_Obj_t * Saig_ManGetLabeledRegister_rec( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pResult;
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return NULL;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Saig_ObjIsPi(p, pObj) )
        return NULL;
    if ( Saig_ObjIsLo(p, pObj) )
    {
        if ( pObj->fMarkA || pObj->fMarkB )
            return pObj;
        return Saig_ManGetLabeledRegister_rec( p, Aig_ObjFanin0( Saig_ObjLoToLi(p, pObj) ) );
    }
    assert( Aig_ObjIsNode(pObj) );
    pResult = Saig_ManGetLabeledRegister_rec( p, Aig_ObjFanin0(pObj) );
    if ( pResult )
        return pResult;
    return Saig_ManGetLabeledRegister_rec( p, Aig_ObjFanin1(pObj) );
}